

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

uint8_t * __thiscall
Lodtalk::MethodAssembler::PopStoreTemporal::encode(PopStoreTemporal *this,uint8_t *buffer)

{
  uint8_t *buffer_local;
  PopStoreTemporal *this_local;
  
  if (this->index < 8) {
    this_local = (PopStoreTemporal *)(buffer + 1);
    *buffer = (char)this->index + 0xd0;
  }
  else {
    *buffer = 0xf2;
    this_local = (PopStoreTemporal *)(buffer + 2);
    buffer[1] = (uint8_t)this->index;
  }
  return (uint8_t *)this_local;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
        if(index < BytecodeSet::PopStoreTemporalVariableShortRangeSize)
        {
            *buffer++ = uint8_t(BytecodeSet::PopStoreTemporalVariableShortFirst + index);
            return buffer;
        }

        *buffer++ = BytecodeSet::PopStoreTemporalVariable;
        *buffer++ = (uint8_t)index;
        return buffer;
	}